

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O0

void writecolourmap(nn_quant *nnq,FILE *f)

{
  int local_20;
  int local_1c;
  int j;
  int i;
  FILE *f_local;
  nn_quant *nnq_local;
  
  for (local_1c = 3; -1 < local_1c; local_1c = local_1c + -1) {
    for (local_20 = 0; local_20 < nnq->netsize; local_20 = local_20 + 1) {
      putc(nnq->network[local_20][local_1c],(FILE *)f);
    }
  }
  return;
}

Assistant:

void writecolourmap(nnq, f)
nn_quant *nnq;
FILE *f;
{
	int i,j;

	for (i=3; i>=0; i--)
		for (j=0; j < nnq->netsize; j++)
			putc(nnq->network[j][i], f);
}